

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetCommand.cxx
# Opt level: O3

bool __thiscall
cmSetCommand::InitialPass
          (cmSetCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  int iVar4;
  CacheEntryType CVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  cmState *this_00;
  uint uVar9;
  pointer pbVar10;
  bool bVar11;
  pointer pbVar12;
  ulong uVar13;
  long lVar14;
  pointer doc;
  bool bVar15;
  string value;
  uint local_98;
  string local_90;
  string local_70;
  CacheEntryType local_4c;
  cmCommand *local_48;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_40;
  
  pbVar12 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  uVar13 = (long)pbVar10 - (long)pbVar12;
  if (uVar13 == 0) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    return false;
  }
  pcVar8 = (pbVar12->_M_dataplus)._M_p;
  local_48 = &this->super_cmCommand;
  iVar4 = strncmp(pcVar8,"ENV{",4);
  if ((iVar4 == 0) && (sVar6 = strlen(pcVar8), 5 < sVar6)) {
    pcVar7 = (char *)operator_new__(sVar6);
    sVar6 = strlen(pcVar8);
    strncpy(pcVar7,pcVar8 + 4,sVar6 - 5);
    sVar6 = strlen(pcVar8);
    pcVar7[sVar6 - 5] = '\0';
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    sVar6 = strlen(pcVar7);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pcVar7,pcVar7 + sVar6);
    std::__cxx11::string::append((char *)&local_70);
    pcVar8 = getenv(pcVar7);
    operator_delete__(pcVar7);
    pbVar12 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (((ulong)((long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12) < 0x21) ||
       (pbVar12[1]._M_string_length == 0)) {
      if (pcVar8 != (char *)0x0) goto LAB_00307781;
    }
    else {
      pcVar7 = pbVar12[1]._M_dataplus._M_p;
      if ((pcVar8 == (char *)0x0) || (iVar4 = strcmp(pcVar8,pcVar7), iVar4 != 0)) {
        std::__cxx11::string::_M_append((char *)&local_70,(ulong)pcVar7);
LAB_00307781:
        cmsys::SystemTools::PutEnv(&local_70);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      return true;
    }
    goto LAB_003077cf;
  }
  lVar14 = (long)pbVar10 - (long)pbVar12 >> 5;
  if (lVar14 == 2) {
    iVar4 = std::__cxx11::string::compare((char *)((long)pbVar12 + (uVar13 - 0x20)));
    if (iVar4 != 0) {
      pbVar12 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar10 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      uVar13 = (long)pbVar10 - (long)pbVar12;
      goto LAB_00307696;
    }
    pcVar2 = local_48->Makefile;
    std::__cxx11::string::string((string *)&local_70,pcVar8,(allocator *)&local_90);
    cmMakefile::RaiseScope(pcVar2,&local_70,(char *)0x0);
  }
  else {
    if (lVar14 != 1) {
LAB_00307696:
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      if (uVar13 < 0x21) {
LAB_00307720:
        local_98 = 0;
LAB_00307723:
        if ((ulong)((long)uVar13 >> 5) < 4) {
          bVar15 = false;
          bVar3 = false;
          uVar9 = local_98;
        }
        else {
          iVar4 = std::__cxx11::string::compare
                            ((char *)(pbVar12 + (((long)uVar13 >> 5) - (ulong)(byte)local_98) + -3))
          ;
          bVar15 = iVar4 == 0;
          uVar9 = local_98 + 3;
          if (!bVar15) {
            uVar9 = local_98;
          }
          pbVar12 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pbVar10 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          bVar3 = false;
        }
      }
      else {
        iVar4 = std::__cxx11::string::compare
                          ((char *)((long)&pbVar12[-1]._M_dataplus._M_p + uVar13));
        local_98 = 0;
        pbVar12 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pbVar10 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar4 != 0) {
          uVar13 = (long)pbVar10 - (long)pbVar12;
          if (uVar13 < 0x81) goto LAB_00307720;
          iVar4 = std::__cxx11::string::compare((char *)((long)pbVar12 + (uVar13 - 0x20)));
          pbVar12 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pbVar10 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          uVar13 = (long)pbVar10 - (long)pbVar12;
          local_98 = (uint)(iVar4 == 0);
          goto LAB_00307723;
        }
        uVar9 = 1;
        bVar3 = true;
        bVar15 = false;
      }
      local_40.Begin._M_current = pbVar12 + 1;
      local_40.End._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)pbVar10 - (ulong)(uVar9 << 5));
      cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                (&local_90,&local_40,";");
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_90);
      paVar1 = &local_90.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (bVar3) {
        pcVar2 = local_48->Makefile;
        std::__cxx11::string::string((string *)&local_90,pcVar8,(allocator *)&local_40);
        cmMakefile::RaiseScope(pcVar2,&local_90,local_70._M_dataplus._M_p);
LAB_0030787c:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != paVar1) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        bVar11 = true;
      }
      else {
        iVar4 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish + -1));
        if (iVar4 != 0) {
          pbVar12 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          uVar13 = (long)(args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12;
          if (((uVar13 < 0x21) ||
              (iVar4 = std::__cxx11::string::compare((char *)((long)pbVar12 + (uVar13 - 0x40))),
              iVar4 != 0)) && (bVar3 = SUB41(local_98,0), bVar3 != true || bVar15)) {
            if (bVar15) {
              pbVar12 = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              lVar14 = ((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12 >> 5) -
                       (ulong)bVar3;
              local_4c = cmState::StringToCacheEntryType(pbVar12[lVar14 + -2]._M_dataplus._M_p);
              doc = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[lVar14 + -1]._M_dataplus._M_p;
            }
            else {
              local_4c = STRING;
              doc = (char *)0x0;
            }
            this_00 = cmMakefile::GetState(local_48->Makefile);
            std::__cxx11::string::string((string *)&local_90,pcVar8,(allocator *)&local_40);
            pcVar7 = cmState::GetCacheEntryValue(this_00,&local_90);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != paVar1) {
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            }
            if (pcVar7 != (char *)0x0) {
              std::__cxx11::string::string((string *)&local_90,pcVar8,(allocator *)&local_40);
              CVar5 = cmState::GetCacheEntryType(this_00,&local_90);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != paVar1) {
                operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1
                               );
              }
              if ((bVar3 == false) &&
                 (bVar11 = true, (bool)(local_4c != INTERNAL & bVar15 & CVar5 != UNINITIALIZED)))
              goto LAB_0030796a;
            }
            pcVar2 = local_48->Makefile;
            if (bVar15) {
              std::__cxx11::string::string((string *)&local_90,pcVar8,(allocator *)&local_40);
              cmMakefile::AddCacheDefinition
                        (pcVar2,&local_90,local_70._M_dataplus._M_p,doc,local_4c,bVar3);
            }
            else {
              std::__cxx11::string::string((string *)&local_90,pcVar8,(allocator *)&local_40);
              cmMakefile::AddDefinition(pcVar2,&local_90,local_70._M_dataplus._M_p);
            }
            goto LAB_0030787c;
          }
        }
        local_90._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"given invalid arguments for CACHE mode.","");
        cmCommand::SetError(local_48,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != paVar1) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        bVar11 = false;
      }
LAB_0030796a:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                 local_70.field_2._M_local_buf[0]) + 1);
        return bVar11;
      }
      return bVar11;
    }
    pcVar2 = local_48->Makefile;
    std::__cxx11::string::string((string *)&local_70,pcVar8,(allocator *)&local_90);
    cmMakefile::RemoveDefinition(pcVar2,&local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == &local_70.field_2) {
    return true;
  }
LAB_003077cf:
  operator_delete(local_70._M_dataplus._M_p,
                  CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                           local_70.field_2._M_local_buf[0]) + 1);
  return true;
}

Assistant:

bool cmSetCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  // watch for ENV signatures
  const char* variable = args[0].c_str(); // VAR is always first
  if (cmHasLiteralPrefix(variable, "ENV{") && strlen(variable) > 5)
    {
    // what is the variable name
    char *varName = new char [strlen(variable)];
    strncpy(varName,variable+4,strlen(variable)-5);
    varName[strlen(variable)-5] = '\0';
    std::string putEnvArg = varName;
    putEnvArg += "=";

    // what is the current value if any
    const char *currValue = getenv(varName);
    delete [] varName;

    // will it be set to something, then set it
    if (args.size() > 1 && !args[1].empty())
      {
      // but only if it is different from current value
      if (!currValue || strcmp(currValue,args[1].c_str()))
        {
        putEnvArg += args[1];
        cmSystemTools::PutEnv(putEnvArg);
        }
      return true;
      }

    // if it will be cleared, then clear it if it isn't already clear
    if (currValue)
      {
      cmSystemTools::PutEnv(putEnvArg);
      }
    return true;
    }

  // SET (VAR) // Removes the definition of VAR.
  if (args.size() == 1)
    {
    this->Makefile->RemoveDefinition(variable);
    return true;
    }
  // SET (VAR PARENT_SCOPE) // Removes the definition of VAR
                            // in the parent scope.
  else if (args.size() == 2 && args[args.size()-1] == "PARENT_SCOPE")
    {
    this->Makefile->RaiseScope(variable, 0);
    return true;
    }

  // here are the remaining options
  //  SET (VAR value )
  //  SET (VAR value PARENT_SCOPE)
  //  SET (VAR CACHE TYPE "doc String" [FORCE])
  //  SET (VAR value CACHE TYPE "doc string" [FORCE])
  std::string value;  // optional
  bool cache = false; // optional
  bool force = false; // optional
  bool parentScope = false;
  cmState::CacheEntryType type
    = cmState::STRING; // required if cache
  const char* docstring = 0; // required if cache

  unsigned int ignoreLastArgs = 0;
  // look for PARENT_SCOPE argument
  if (args.size() > 1 && args[args.size()-1] == "PARENT_SCOPE")
    {
    parentScope = true;
    ignoreLastArgs++;
    }
  else
    {
    // look for FORCE argument
    if (args.size() > 4 && args[args.size()-1] == "FORCE")
      {
      force = true;
      ignoreLastArgs++;
      }

    // check for cache signature
    if (args.size() > 3 && args[args.size() - 3 - (force ? 1 : 0)] == "CACHE")
      {
      cache = true;
      ignoreLastArgs+=3;
      }
    }

  // collect any values into a single semi-colon separated value list
  value = cmJoin(cmMakeRange(args).advance(1).retreat(ignoreLastArgs), ";");

  if (parentScope)
    {
    this->Makefile->RaiseScope(variable, value.c_str());
    return true;
    }


  // we should be nice and try to catch some simple screwups if the last or
  // next to last args are CACHE then they screwed up.  If they used FORCE
  // without CACHE they screwed up
  if ((args[args.size() - 1] == "CACHE") ||
      (args.size() > 1 && args[args.size() - 2] == "CACHE") ||
      (force && !cache))
    {
    this->SetError("given invalid arguments for CACHE mode.");
    return false;
    }

  if(cache)
    {
    std::string::size_type cacheStart = args.size() - 3 - (force ? 1 : 0);
    type = cmState::StringToCacheEntryType(args[cacheStart+1].c_str());
    docstring = args[cacheStart+2].c_str();
    }

  // see if this is already in the cache
  cmState* state = this->Makefile->GetState();
  const char* existingValue = state->GetCacheEntryValue(variable);
  if(existingValue &&
      (state->GetCacheEntryType(variable) != cmState::UNINITIALIZED))
    {
    // if the set is trying to CACHE the value but the value
    // is already in the cache and the type is not internal
    // then leave now without setting any definitions in the cache
    // or the makefile
    if(cache && type != cmState::INTERNAL && !force)
      {
      return true;
      }
    }

  // if it is meant to be in the cache then define it in the cache
  if(cache)
    {
    this->Makefile->AddCacheDefinition(variable,
                                   value.c_str(),
                                   docstring,
                                   type, force);
    }
  else
    {
    // add the definition
    this->Makefile->AddDefinition(variable, value.c_str());
    }
  return true;
}